

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

int lws_http_redirect_hit
              (lws_context_per_thread *pt,lws *wsi,lws_http_mount *hit,char *uri_ptr,int uri_len,
              int *h)

{
  char *pcVar1;
  int iVar2;
  uchar *loc;
  char *pcVar3;
  uchar *end;
  uchar *p;
  uchar *start;
  char *pcStack_48;
  int n;
  char *s;
  int *h_local;
  char *pcStack_30;
  int uri_len_local;
  char *uri_ptr_local;
  lws_http_mount *hit_local;
  lws *wsi_local;
  lws_context_per_thread *pt_local;
  
  *h = 0;
  pcStack_48 = uri_ptr + (int)(uint)hit->mountpoint_len;
  if (((((hit->mountpoint_len < 2) && (hit->origin_protocol != '\x04')) &&
       (hit->origin_protocol != '\x05')) ||
      (((*pcStack_48 == '/' && (hit->origin_protocol != '\x04')) && (hit->origin_protocol != '\x05')
       ))) || ((hit->origin_protocol == '\x03' || (hit->origin_protocol == '\x06')))) {
    return 0;
  }
  end = pt->serv_buf + 0x10;
  loc = end + ((ulong)wsi->context->pt_serv_buf_size - 0x210);
  *h = 1;
  p = end;
  s = (char *)h;
  h_local._4_4_ = uri_len;
  pcStack_30 = uri_ptr;
  uri_ptr_local = (char *)hit;
  hit_local = (lws_http_mount *)wsi;
  wsi_local = (lws *)pt;
  _lws_log(8,"Doing 301 \'%s\' org %s\n",pcStack_48,hit->origin);
  if ((uri_ptr_local[0x4d] == '\x04') || (uri_ptr_local[0x4d] == '\x05')) {
    start._4_4_ = lws_snprintf((char *)loc,0x100,"%s%s",oprot[(int)((byte)uri_ptr_local[0x4d] & 1)],
                               *(undefined8 *)(uri_ptr_local + 0x10));
  }
  else {
    iVar2 = lws_hdr_total_length((lws *)hit_local,WSI_TOKEN_HOST);
    if (iVar2 == 0) {
      iVar2 = lws_hdr_total_length((lws *)hit_local,WSI_TOKEN_HTTP_COLON_AUTHORITY);
      if (iVar2 == 0) goto LAB_0014f55f;
      iVar2 = lws_is_ssl((lws *)hit_local);
      pcVar1 = oprot[(int)(uint)(iVar2 != 0)];
      pcVar3 = lws_hdr_simple_ptr((lws *)hit_local,WSI_TOKEN_HTTP_COLON_AUTHORITY);
      start._4_4_ = lws_snprintf((char *)loc,0x100,"%s%s%s/",pcVar1,pcVar3,pcStack_30);
    }
    else {
      iVar2 = lws_is_ssl((lws *)hit_local);
      pcVar1 = oprot[(int)(uint)(iVar2 != 0)];
      pcVar3 = lws_hdr_simple_ptr((lws *)hit_local,WSI_TOKEN_HOST);
      start._4_4_ = lws_snprintf((char *)loc,0x100,"%s%s%s/",pcVar1,pcVar3,pcStack_30);
    }
  }
  lws_clean_url((char *)loc);
  start._4_4_ = lws_http_redirect((lws *)hit_local,0x12d,loc,start._4_4_,&end,loc);
  if (-1 < start._4_4_) {
    iVar2 = lws_http_transaction_completed((lws *)hit_local);
    return iVar2;
  }
LAB_0014f55f:
  lws_header_table_detach((lws *)hit_local,1);
  return 1;
}

Assistant:

static int
lws_http_redirect_hit(struct lws_context_per_thread *pt, struct lws *wsi,
		      const struct lws_http_mount *hit, char *uri_ptr,
		      int uri_len, int *h)
{
	char *s;
	int n;

	*h = 0;
	s = uri_ptr + hit->mountpoint_len;

	/*
	 * if we have a mountpoint like https://xxx.com/yyy
	 * there is an implied / at the end for our purposes since
	 * we can only mount on a "directory".
	 *
	 * But if we just go with that, the browser cannot understand
	 * that he is actually looking down one "directory level", so
	 * even though we give him /yyy/abc.html he acts like the
	 * current directory level is /.  So relative urls like "x.png"
	 * wrongly look outside the mountpoint.
	 *
	 * Therefore if we didn't come in on a url with an explicit
	 * / at the end, we must redirect to add it so the browser
	 * understands he is one "directory level" down.
	 */
	if ((hit->mountpoint_len > 1 ||
	     (hit->origin_protocol == LWSMPRO_REDIR_HTTP ||
	      hit->origin_protocol == LWSMPRO_REDIR_HTTPS)) &&
	    (*s != '/' ||
	     (hit->origin_protocol == LWSMPRO_REDIR_HTTP ||
	      hit->origin_protocol == LWSMPRO_REDIR_HTTPS)) &&
	    (hit->origin_protocol != LWSMPRO_CGI &&
	     hit->origin_protocol != LWSMPRO_CALLBACK)) {
		unsigned char *start = pt->serv_buf + LWS_PRE, *p = start,
			      *end = p + wsi->context->pt_serv_buf_size -
					LWS_PRE - 512;

		*h = 1;

		lwsl_info("Doing 301 '%s' org %s\n", s, hit->origin);

		/* > at start indicates deal with by redirect */
		if (hit->origin_protocol == LWSMPRO_REDIR_HTTP ||
		    hit->origin_protocol == LWSMPRO_REDIR_HTTPS)
			n = lws_snprintf((char *)end, 256, "%s%s",
				    oprot[hit->origin_protocol & 1],
				    hit->origin);
		else {
			if (!lws_hdr_total_length(wsi, WSI_TOKEN_HOST)) {
				if (!lws_hdr_total_length(wsi,
						WSI_TOKEN_HTTP_COLON_AUTHORITY))
					goto bail_nuke_ah;
				n = lws_snprintf((char *)end, 256,
				    "%s%s%s/", oprot[!!lws_is_ssl(wsi)],
				    lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_COLON_AUTHORITY),
				    uri_ptr);
			} else
				n = lws_snprintf((char *)end, 256,
				    "%s%s%s/", oprot[!!lws_is_ssl(wsi)],
				    lws_hdr_simple_ptr(wsi, WSI_TOKEN_HOST),
				    uri_ptr);
		}

		lws_clean_url((char *)end);
		n = lws_http_redirect(wsi, HTTP_STATUS_MOVED_PERMANENTLY,
				      end, n, &p, end);
		if ((int)n < 0)
			goto bail_nuke_ah;

		return lws_http_transaction_completed(wsi);
	}

	return 0;

bail_nuke_ah:
	lws_header_table_detach(wsi, 1);

	return 1;
}